

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_precompute(response_layer *layer,integral_image *iimage)

{
  uint uVar1;
  int cols;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  bool *pbVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int cols_00;
  int rows;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int row;
  int col;
  int iVar13;
  int col_00;
  int col_01;
  int col_02;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pfVar4 = layer->response;
  uVar1 = layer->height;
  cols = layer->filter_size;
  uVar2 = layer->width;
  pbVar5 = layer->laplacian;
  iVar3 = layer->step;
  cols_00 = cols / 3;
  iVar13 = (cols + -1) / 2;
  fVar15 = 1.0 / (float)(cols * cols);
  rows = cols_00 * 2 + -1;
  lVar12 = 0;
  for (uVar9 = 0; uVar9 != (~((int)uVar1 >> 0x1f) & uVar1); uVar9 = uVar9 + 1) {
    iVar10 = uVar9 * iVar3;
    lVar12 = (long)(int)lVar12;
    row = iVar10 - (cols_00 + -1);
    col_00 = 1;
    col_02 = -(cols / 6);
    col = -iVar13;
    col_01 = -cols_00;
    uVar11 = ~((int)uVar2 >> 0x1f) & uVar2;
    while (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
      fVar16 = box_integral(iimage,row,col,rows,cols);
      auVar20._0_4_ = box_integral(iimage,row,col_02,rows,cols_00);
      auVar20._4_60_ = extraout_var;
      auVar7 = vfmadd213ss_fma(auVar20._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar16));
      fVar16 = box_integral(iimage,iVar10 - iVar13,col_01 + 1,cols,rows);
      auVar21._0_4_ = box_integral(iimage,iVar10 - cols / 6,col_01 + 1,cols_00,rows);
      auVar21._4_60_ = extraout_var_00;
      auVar6 = vfmadd132ss_fma(auVar21._0_16_,ZEXT416((uint)fVar16),ZEXT416(0xc0400000));
      fVar17 = box_integral(iimage,iVar10 - cols_00,col_00,cols_00,cols_00);
      fVar18 = box_integral(iimage,iVar10 + 1,col_01,cols_00,cols_00);
      fVar19 = box_integral(iimage,iVar10 - cols_00,col_01,cols_00,cols_00);
      fVar16 = box_integral(iimage,iVar10 + 1,col_00,cols_00,cols_00);
      fVar16 = ((fVar18 + fVar17) - fVar19) - fVar16;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16 * -0.81)),ZEXT416((uint)auVar7._0_4_),
                               ZEXT416((uint)auVar6._0_4_));
      pfVar4[lVar12] = auVar8._0_4_ * fVar15 * fVar15;
      pbVar5[lVar12] = 0.0 <= auVar7._0_4_ + auVar6._0_4_;
      lVar12 = lVar12 + 1;
      col = col + iVar3;
      col_02 = col_02 + iVar3;
      col_01 = col_01 + iVar3;
      col_00 = col_00 + iVar3;
    }
  }
  return;
}

Assistant:

void compute_response_layer_precompute(struct response_layer* layer, struct integral_image* iimage) {
    /*
    optimizations:
        - simplifying normalization and precomputing inv_area_square => -2 flops per loop iteration
        - precomputation of indices
    */

    float Dxx, Dyy, Dxy;
    int x, y;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    float inv_area_square = inv_area*inv_area;

    int lobe_div_2 = lobe / 2;
    int lobe_sub_1 = lobe - 1;
    int lobe_mul_2_sub_1 = 2*lobe - 1;

    for (int i = 0, ind = 0; i < height; ++i) {
        x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            y = j*step;

            // // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe_sub_1, y - border, lobe_mul_2_sub_1, filter_size)
                    - 3 * box_integral(iimage, x - lobe_sub_1, y - lobe_div_2, lobe_mul_2_sub_1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe_sub_1, filter_size, lobe_mul_2_sub_1)
                    - 3 * box_integral(iimage, x - lobe_div_2, y - lobe_sub_1, lobe, lobe_mul_2_sub_1);

            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Calculate Determinant & normalize
            response[ind] = inv_area_square*(Dxx * Dyy - 0.81f * Dxy * Dxy);

            // Calculate Laplacian (scaling does not matter as rescaling both summands keeps the sign)
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
        }
    }

}